

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  curl_socket_t cVar1;
  Curl_easy *data_00;
  CURLcode CVar2;
  int iVar3;
  time_t tVar4;
  uint *puVar5;
  bool bVar6;
  time_t local_78;
  curl_socket_t local_68;
  curl_socket_t local_64;
  curl_socket_t readfd;
  curl_socket_t writefd;
  int what;
  time_t timeout_ms;
  curl_socket_t sockfd;
  ssl_connect_data *connssl;
  Curl_easy *data;
  CURLcode result;
  _Bool *done_local;
  _Bool nonblocking_local;
  int sockindex_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  cVar1 = conn->sock[sockindex];
  if (conn->ssl[sockindex].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  if (conn->ssl[sockindex].connecting_state == ssl_connect_1) {
    tVar4 = Curl_timeleft(data_00,(timeval *)0x0,true);
    if (tVar4 < 0) {
      Curl_failf(data_00,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    CVar2 = ossl_connect_step1(conn,sockindex);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
  while( true ) {
    do {
      bVar6 = true;
      if ((conn->ssl[sockindex].connecting_state != ssl_connect_2) &&
         (bVar6 = true, conn->ssl[sockindex].connecting_state != ssl_connect_2_reading)) {
        bVar6 = conn->ssl[sockindex].connecting_state == ssl_connect_2_writing;
      }
      if (!bVar6) {
        if ((conn->ssl[sockindex].connecting_state != ssl_connect_3) ||
           (conn_local._4_4_ = ossl_connect_step3(conn,sockindex), conn_local._4_4_ == CURLE_OK)) {
          if (conn->ssl[sockindex].connecting_state == ssl_connect_done) {
            conn->ssl[sockindex].state = ssl_connection_complete;
            conn->recv[sockindex] = ossl_recv;
            conn->send[sockindex] = ossl_send;
            *done = true;
          }
          else {
            *done = false;
          }
          conn->ssl[sockindex].connecting_state = ssl_connect_1;
          conn_local._4_4_ = CURLE_OK;
        }
        return conn_local._4_4_;
      }
      local_78 = Curl_timeleft(data_00,(timeval *)0x0,true);
      if (local_78 < 0) {
        Curl_failf(data_00,"SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      if ((conn->ssl[sockindex].connecting_state == ssl_connect_2_reading) ||
         (conn->ssl[sockindex].connecting_state == ssl_connect_2_writing)) {
        local_64 = cVar1;
        if (conn->ssl[sockindex].connecting_state != ssl_connect_2_writing) {
          local_64 = -1;
        }
        local_68 = cVar1;
        if (conn->ssl[sockindex].connecting_state != ssl_connect_2_reading) {
          local_68 = -1;
        }
        if (nonblocking) {
          local_78 = 0;
        }
        iVar3 = Curl_socket_check(local_68,-1,local_64,local_78);
        if (iVar3 < 0) {
          puVar5 = (uint *)__errno_location();
          Curl_failf(data_00,"select/poll on SSL socket, errno: %d",(ulong)*puVar5);
          return CURLE_SSL_CONNECT_ERROR;
        }
        if (iVar3 == 0) {
          if (nonblocking) {
            *done = false;
            return CURLE_OK;
          }
          Curl_failf(data_00,"SSL connection timeout");
          return CURLE_OPERATION_TIMEDOUT;
        }
      }
      CVar2 = ossl_connect_step2(conn,sockindex);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
    } while (!nonblocking);
    if (conn->ssl[sockindex].connecting_state == ssl_connect_2) {
      return CURLE_OK;
    }
    if (conn->ssl[sockindex].connecting_state == ssl_connect_2_reading) break;
    if (conn->ssl[sockindex].connecting_state == ssl_connect_2_writing) {
      return CURLE_OK;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}